

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_addi_8(m68k_info *info)

{
  m68k_info *in_RDI;
  int unaff_retaddr;
  uint8_t in_stack_0000000b;
  int in_stack_0000000c;
  
  read_imm_8(in_RDI);
  build_imm_ea(info,in_stack_0000000c,in_stack_0000000b,unaff_retaddr);
  return;
}

Assistant:

static void d68000_addi_8(m68k_info *info)
{
	build_imm_ea(info, M68K_INS_ADDI, 1, read_imm_8(info));
}